

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

int __thiscall ncnn::Clip::forward_inplace_int8(Clip *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  
  iVar1 = bottom_top_blob->c;
  uVar6 = bottom_top_blob->h * bottom_top_blob->w;
  fVar10 = this->max;
  fVar9 = roundf(this->min);
  iVar3 = (int)fVar9;
  if ((int)fVar9 < -0x7e) {
    iVar3 = -0x7f;
  }
  if (0x7e < iVar3) {
    iVar3 = 0x7f;
  }
  fVar10 = roundf(fVar10);
  iVar8 = -0x7f;
  if (-0x7f < (int)fVar10) {
    iVar8 = (int)fVar10;
  }
  if (0x7e < iVar8) {
    iVar8 = 0x7f;
  }
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      if (0 < (int)uVar6) {
        lVar5 = bottom_top_blob->elemsize * bottom_top_blob->cstep * lVar4;
        pvVar2 = bottom_top_blob->data;
        uVar7 = 0;
        do {
          if (*(char *)((long)pvVar2 + uVar7 + lVar5) < (char)iVar3) {
            *(char *)((long)pvVar2 + uVar7 + lVar5) = (char)iVar3;
          }
          if ((char)iVar8 < *(char *)((long)pvVar2 + uVar7 + lVar5)) {
            *(char *)((long)pvVar2 + uVar7 + lVar5) = (char)iVar8;
          }
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != iVar1);
  }
  return 0;
}

Assistant:

int Clip::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
    signed char min_int8 = float2int8(min);
    signed char max_int8 = float2int8(max);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        signed char* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < min_int8)
                ptr[i] = min_int8;
            if (ptr[i] > max_int8)
                ptr[i] = max_int8;
        }
    }

    return 0;
}